

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

void * __thiscall
google::protobuf::internal::ArenaImpl::AllocateAlignedAndAddCleanup
          (ArenaImpl *this,size_t n,_func_void_void_ptr *cleanup)

{
  void *pvVar1;
  SerialArena *pSVar2;
  long *in_FS_OFFSET;
  bool bVar3;
  
  if (in_FS_OFFSET[-2] == this->lifecycle_id_) {
    bVar3 = true;
    pSVar2 = (SerialArena *)in_FS_OFFSET[-1];
  }
  else {
    pSVar2 = (this->hint_)._M_b._M_p;
    if (pSVar2 == (SerialArena *)0x0) {
      bVar3 = false;
    }
    else {
      bVar3 = pSVar2->owner_ == (void *)(*in_FS_OFFSET + -0x10);
    }
  }
  if (bVar3) {
    pvVar1 = SerialArena::AllocateAlignedAndAddCleanup(pSVar2,n,cleanup);
    return pvVar1;
  }
  pSVar2 = GetSerialArena(this);
  pvVar1 = SerialArena::AllocateAlignedAndAddCleanup(pSVar2,n,cleanup);
  return pvVar1;
}

Assistant:

inline PROTOBUF_ALWAYS_INLINE bool ArenaImpl::GetSerialArenaFast(
    ArenaImpl::SerialArena** arena) {
  // If this thread already owns a block in this arena then try to use that.
  // This fast path optimizes the case where multiple threads allocate from the
  // same arena.
  ThreadCache* tc = &thread_cache();
  if (PROTOBUF_PREDICT_TRUE(tc->last_lifecycle_id_seen == lifecycle_id_)) {
    *arena = tc->last_serial_arena;
    return true;
  }

  // Check whether we own the last accessed SerialArena on this arena.  This
  // fast path optimizes the case where a single thread uses multiple arenas.
  SerialArena* serial = hint_.load(std::memory_order_acquire);
  if (PROTOBUF_PREDICT_TRUE(serial != NULL && serial->owner() == tc)) {
    *arena = serial;
    return true;
  }

  return false;
}